

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

proxy * __thiscall
cs::allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>::
alloc<int,cs_impl::any::holder<cs::tree_type<cs::token_base*>>*>
          (allocator_type<cs_impl::any::proxy,_512UL,_cs_impl::default_allocator_provider> *this,
          int *args,holder<cs::tree_type<cs::token_base_*>_> **args_1)

{
  holder<cs::tree_type<cs::token_base_*>_> *phVar1;
  __int_type _Var2;
  proxy *__args;
  proxy *in_RDX;
  new_allocator<cs_impl::any::proxy> *in_RSI;
  holder<cs::tree_type<cs::token_base_*>_> **in_RDI;
  proxy *ptr;
  void *pvVar3;
  
  pvVar3 = (void *)0x0;
  if (in_RDI[0x201] != (holder<cs::tree_type<cs::token_base_*>_> *)0x0) {
    _Var2 = std::__atomic_base::operator_cast_to_unsigned_long
                      ((__atomic_base<unsigned_long> *)in_RDX);
    if (_Var2 == 0) {
      phVar1 = in_RDI[0x201];
      in_RDI[0x201] = (holder<cs::tree_type<cs::token_base_*>_> *)((long)&phVar1[-1].mDat.mRoot + 7)
      ;
      __args = (proxy *)in_RDI[(long)((long)&phVar1[-1].mDat.mRoot + 7)];
      goto LAB_004bc9a4;
    }
  }
  __args = __gnu_cxx::new_allocator<cs_impl::any::proxy>::allocate(in_RSI,(size_type)in_RDX,pvVar3);
LAB_004bc9a4:
  __gnu_cxx::new_allocator<cs_impl::any::proxy>::
  construct<cs_impl::any::proxy,int,cs_impl::any::holder<cs::tree_type<cs::token_base*>>*>
            (in_RSI,in_RDX,(int *)__args,in_RDI);
  return __args;
}

Assistant:

inline T *alloc(ArgsT &&...args)
		{
			T *ptr = nullptr;
			if (mOffset > 0 && global_thread_counter == 0)
				ptr = mPool[--mOffset];
			else
				ptr = mAlloc.allocate(1);
			mAlloc.construct(ptr, std::forward<ArgsT>(args)...);
			return ptr;
		}